

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

PythonParameter * __thiscall caffe::LayerParameter::mutable_python_param(LayerParameter *this)

{
  PythonParameter *this_00;
  LayerParameter *this_local;
  
  set_has_python_param(this);
  if (this->python_param_ == (PythonParameter *)0x0) {
    this_00 = (PythonParameter *)operator_new(0x38);
    PythonParameter::PythonParameter(this_00);
    this->python_param_ = this_00;
  }
  return this->python_param_;
}

Assistant:

inline ::caffe::PythonParameter* LayerParameter::mutable_python_param() {
  set_has_python_param();
  if (python_param_ == NULL) {
    python_param_ = new ::caffe::PythonParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.python_param)
  return python_param_;
}